

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderViewPrivate::setHeaderMode(QHeaderViewPrivate *this,HeaderMode mode)

{
  long lVar1;
  QHeaderViewPrivate *this_00;
  HeaderMode in_ESI;
  QHeaderViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int sectionCount;
  bool avoidSectionMemoryUsage;
  QHeaderView *q;
  QSignalBlocker b;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint newCount;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHeaderViewPrivate *)q_func(in_RDI);
  if (in_ESI != in_RDI->headerMode) {
    newCount = CONCAT13(in_ESI == InitialNoSectionMemoryUsage,(int3)in_stack_ffffffffffffffcc);
    in_RDI->headerMode = in_ESI;
    QSignalBlocker::QSignalBlocker
              ((QSignalBlocker *)this_00,(QObject *)CONCAT44(newCount,in_stack_ffffffffffffffc8));
    if ((newCount & 0x1000000) == 0) {
      in_RDI->length = 0;
      in_RDI->countInNoSectionItemsMode = 0;
      QHeaderView::initializeSections((QHeaderView *)CONCAT44(newCount,in_stack_ffffffffffffffc8));
    }
    else {
      QList<QHeaderViewPrivate::SectionItem>::count
                ((QList<QHeaderViewPrivate::SectionItem> *)0x83945a);
      in_RDI->countInNoSectionItemsMode = 0;
      QList<QHeaderViewPrivate::SectionItem>::clear
                ((QList<QHeaderViewPrivate::SectionItem> *)in_RDI);
      QList<int>::clear((QList<int> *)in_RDI);
      QList<int>::clear((QList<int> *)in_RDI);
      QHash<int,_int>::clear((QHash<int,_int> *)in_RDI);
      QHash<int,_int>::clear((QHash<int,_int> *)in_RDI);
      updateCountInNoSectionItemsMode(this_00,newCount);
    }
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderViewPrivate::setHeaderMode(HeaderMode mode)
{
    Q_Q(QHeaderView);

    if (mode == headerMode)
        return;

    const bool avoidSectionMemoryUsage = (mode == HeaderMode::InitialNoSectionMemoryUsage);
    headerMode = mode;

    QSignalBlocker b(q); // Avoid emit of section count changed.
    if (avoidSectionMemoryUsage) {
        const int sectionCount = sectionItems.count();
        countInNoSectionItemsMode = 0;
        sectionItems.clear();
        visualIndices.clear();
        logicalIndices.clear();
        hiddenSectionSize.clear();
        cascadingSectionSize.clear();
        updateCountInNoSectionItemsMode(sectionCount);
    }
    else {
        length = 0;
        countInNoSectionItemsMode = 0;
        q->initializeSections();
    }
}